

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O3

void monflee(monst *mtmp,int fleetime,boolean first,boolean fleemsg)

{
  char cVar1;
  boolean bVar2;
  uint uVar3;
  char *pcVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  char *line;
  
  if (u.ustuck == mtmp) {
    if ((u._1052_1_ & 1) == 0) {
      bVar2 = sticks(youmonst.data);
      if (bVar2 == '\0') {
        unstuck(mtmp);
        pline("You get released!");
      }
    }
    else {
      expels(mtmp,mtmp->data,'\x01');
    }
  }
  if ((first != '\0') && ((mtmp->field_0x62 & 1) != 0)) goto LAB_001f0c64;
  if (fleetime == 0) {
    mtmp->mfleetim = '\0';
    uVar3 = *(uint *)&mtmp->field_0x60;
  }
  else {
    uVar3 = *(uint *)&mtmp->field_0x60;
    if (((byte)(uVar3 >> 0x10) & mtmp->mfleetim == 0) == 0) {
      iVar6 = (uint)mtmp->mfleetim + fleetime;
      iVar7 = 0x7f;
      if (iVar6 < 0x7f) {
        iVar7 = iVar6;
      }
      uVar5 = '\x02';
      if (iVar6 != 1) {
        uVar5 = (uchar)iVar7;
      }
      mtmp->mfleetim = uVar5;
    }
  }
  if ((fleemsg != '\0') && ((uVar3 & 0x10000) == 0)) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001f0bdd;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f0b72;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f0b69;
      }
      else {
LAB_001f0b69:
        if (ublindf == (obj *)0x0) goto LAB_001f0c60;
LAB_001f0b72:
        if (ublindf->oartifact != '\x1d') goto LAB_001f0c60;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_001f0c60;
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') goto LAB_001f0c60;
    }
LAB_001f0bdd:
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) == 0) goto LAB_001f0c1f;
    }
    else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f0c1f:
      if (((u._1052_1_ & 0x20) == 0) && (mtmp->mfrozen == '\0')) {
        cVar1 = mtmp->data->mlet;
        pcVar4 = Monnam(mtmp);
        line = "%s turns to flee!";
        if (cVar1 == '\r') {
          line = "%s mimics a chicken for a moment!";
        }
        pline(line,pcVar4);
      }
    }
  }
LAB_001f0c60:
  mtmp->field_0x62 = mtmp->field_0x62 | 1;
LAB_001f0c64:
  mtmp->mtrack[0].x = '\0';
  mtmp->mtrack[0].y = '\0';
  mtmp->mtrack[1].x = '\0';
  mtmp->mtrack[1].y = '\0';
  mtmp->mtrack[2].x = '\0';
  mtmp->mtrack[2].y = '\0';
  mtmp->mtrack[3].x = '\0';
  mtmp->mtrack[3].y = '\0';
  return;
}

Assistant:

void monflee(struct monst *mtmp, int fleetime, boolean first, boolean fleemsg)
{
	if (u.ustuck == mtmp) {
	    if (u.uswallow)
		expels(mtmp, mtmp->data, TRUE);
	    else if (!sticks(youmonst.data)) {
		unstuck(mtmp);	/* monster lets go when fleeing */
		pline("You get released!");
	    }
	}

	if (!first || !mtmp->mflee) {
	    /* don't lose untimed scare */
	    if (!fleetime)
		mtmp->mfleetim = 0;
	    else if (!mtmp->mflee || mtmp->mfleetim) {
		fleetime += mtmp->mfleetim;
		/* ensure monster flees long enough to visibly stop fighting */
		if (fleetime == 1) fleetime++;
		mtmp->mfleetim = min(fleetime, 127);
	    }
	    if (!mtmp->mflee && fleemsg && canseemon(level, mtmp) && !mtmp->mfrozen) {
		if (mtmp->data->mlet != S_MIMIC)
		    pline("%s turns to flee!", (Monnam(mtmp)));
		else
		    pline("%s mimics a chicken for a moment!", (Monnam(mtmp)));
	    }
	    mtmp->mflee = 1;
	}

	/* ignore recently-stepped spaces when made to flee */
	memset(mtmp->mtrack, 0, sizeof(mtmp->mtrack));
}